

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_msg.c
# Opt level: O1

nng_err nni_http_res_parse(nng_http *conn,void *buf,size_t n,size_t *lenp)

{
  char *pcVar1;
  nng_http *conn_00;
  nng_err nVar2;
  nng_err nVar3;
  nng_http_status status;
  char *pcVar4;
  char *pcVar5;
  char *version;
  size_t sVar6;
  bool bVar7;
  size_t local_60;
  size_t cnt;
  size_t *local_50;
  nng_http *local_48;
  nni_http_res *local_40;
  size_t local_38;
  
  local_50 = lenp;
  local_48 = conn;
  local_40 = nni_http_conn_res(conn);
  sVar6 = 0;
  do {
    nVar2 = http_scan_line(buf,n,&local_60);
    nVar3 = NNG_OK;
    if (nVar2 == NNG_OK) {
      sVar6 = sVar6 + local_60;
      pcVar1 = (char *)((long)buf + local_60);
      n = n - local_60;
      if (*buf == '\0') {
        bVar7 = false;
        buf = pcVar1;
      }
      else {
        if ((local_40->data).parsed == true) {
          nVar3 = http_parse_header(local_48,buf);
        }
        else {
          local_38 = sVar6;
          pcVar4 = strchr((char *)buf,0x20);
          nVar3 = NNG_EPROTO;
          sVar6 = local_38;
          if (pcVar4 != (char *)0x0) {
            *pcVar4 = '\0';
            pcVar5 = strchr(pcVar4 + 1,0x20);
            sVar6 = local_38;
            if (pcVar5 != (char *)0x0) {
              *pcVar5 = '\0';
              cnt = (size_t)pcVar5;
              status = atoi(pcVar4 + 1);
              sVar6 = local_38;
              conn_00 = local_48;
              if (0xfffffc7b < status - 1000) {
                nni_http_set_status(local_48,status,(char *)(cnt + 1));
                nVar3 = nni_http_set_version(conn_00,(char *)buf);
              }
            }
          }
          if (nVar3 == NNG_OK) {
            (local_40->data).parsed = true;
            nVar3 = NNG_OK;
          }
        }
        bVar7 = nVar3 == NNG_OK;
        buf = pcVar1;
      }
    }
    else {
      bVar7 = false;
      nVar3 = nVar2;
    }
  } while (bVar7);
  if (nVar3 == NNG_OK) {
    (local_40->data).parsed = false;
  }
  *local_50 = sVar6;
  return nVar3;
}

Assistant:

nng_err
nni_http_res_parse(nng_http *conn, void *buf, size_t n, size_t *lenp)
{

	size_t        len = 0;
	size_t        cnt;
	int           rv  = 0;
	nng_http_res *res = nni_http_conn_res(conn);
	for (;;) {
		uint8_t *line;
		if ((rv = http_scan_line(buf, n, &cnt)) != 0) {
			break;
		}

		len += cnt;
		line = buf;
		buf  = line + cnt;
		n -= cnt;

		if (*line == '\0') {
			break;
		}

		if (res->data.parsed) {
			rv = http_parse_header(conn, line);
		} else if ((rv = http_res_parse_line(conn, line)) == 0) {
			res->data.parsed = true;
		}

		if (rv != 0) {
			break;
		}
	}

	if (rv == 0) {
		res->data.parsed = false;
	}
	*lenp = len;
	return (rv);
}